

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createQuadSphere
          (SceneGraph *this,Vec3fa *center,float radius,size_t N,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  Vec3fa *ptr;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  uint uVar6;
  Node *pNVar7;
  QuadMeshNode *this_00;
  Vec3fa *pVVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint theta;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Quad local_b8;
  float phif;
  undefined4 uStack_a4;
  float local_9c;
  size_t local_98;
  ulong local_90;
  QuadMeshNode *local_88;
  ulong local_80;
  Ref<embree::SceneGraph::MaterialNode> local_78;
  float local_6c;
  uint local_68;
  int local_64;
  int local_60;
  float local_5c;
  ulong local_58;
  Node *local_50;
  ulong local_48;
  ulong local_40;
  uint p00;
  
  local_98 = N;
  this_00 = (QuadMeshNode *)::operator_new(0xd8);
  local_78 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  local_88 = this_00;
  if (local_78.ptr != (MaterialNode *)0x0) {
    (*((local_78.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  QuadMeshNode::QuadMeshNode(this_00,&local_78,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  uVar21 = extraout_XMM0_Db;
  uVar22 = extraout_XMM0_Dc;
  uVar23 = extraout_XMM0_Dd;
  local_50 = (Node *)this;
  if (local_78.ptr != (MaterialNode *)0x0) {
    (*((local_78.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
    uVar21 = extraout_XMM0_Db_00;
    uVar22 = extraout_XMM0_Dc_00;
    uVar23 = extraout_XMM0_Dd_00;
  }
  iVar17 = (int)local_98;
  uVar6 = iVar17 * 2;
  uVar9 = (ulong)uVar6;
  pvVar3 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar15 = (ulong)((iVar17 + 1) * uVar6);
  uVar10 = pvVar3->size_alloced;
  uVar13 = uVar10;
  if ((uVar10 < uVar15) && (uVar12 = uVar10, uVar13 = uVar15, uVar10 != 0)) {
    for (; uVar13 = uVar12, uVar12 < uVar15; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
    }
  }
  if (uVar15 < pvVar3->size_active) {
    pvVar3->size_active = uVar15;
  }
  if (uVar10 == uVar13) {
    pvVar3->size_active = uVar15;
  }
  else {
    ptr = pvVar3->items;
    pVVar8 = (Vec3fa *)alignedMalloc(uVar13 << 4,0x10);
    pvVar3->items = pVVar8;
    lVar14 = 0;
    for (uVar10 = 0; uVar10 < pvVar3->size_active; uVar10 = uVar10 + 1) {
      puVar1 = (undefined8 *)((long)&ptr->field_0 + lVar14);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar14);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar14 = lVar14 + 0x10;
    }
    alignedFree(ptr);
    pvVar3->size_active = uVar15;
    pvVar3->size_alloced = uVar13;
    uVar21 = extraout_XMM0_Db_01;
    uVar22 = extraout_XMM0_Dc_01;
    uVar23 = extraout_XMM0_Dd_01;
  }
  fVar18 = (float)uVar9;
  auVar24._4_4_ = uVar21;
  auVar24._0_4_ = fVar18;
  auVar24._8_4_ = uVar22;
  auVar24._12_4_ = uVar23;
  auVar25._4_4_ = uVar21;
  auVar25._0_4_ = fVar18;
  auVar25._8_4_ = uVar22;
  auVar25._12_4_ = uVar23;
  auVar25 = rcpss(auVar24,auVar25);
  local_5c = (2.0 - fVar18 * auVar25._0_4_) * auVar25._0_4_;
  fVar18 = (float)(local_98 & 0xffffffff);
  auVar26._4_4_ = uVar21;
  auVar26._0_4_ = fVar18;
  auVar26._8_4_ = uVar22;
  auVar26._12_4_ = uVar23;
  auVar4._4_4_ = uVar21;
  auVar4._0_4_ = fVar18;
  auVar4._8_4_ = uVar22;
  auVar4._12_4_ = uVar23;
  auVar25 = rcpss(auVar26,auVar4);
  local_6c = (2.0 - fVar18 * auVar25._0_4_) * auVar25._0_4_;
  _p00 = (ulong)(uVar6 - 1);
  local_88 = (QuadMeshNode *)&local_88->quads;
  local_68 = uVar6 * (int)local_98;
  local_40 = (ulong)(((int)local_98 + -1) * uVar6);
  local_60 = uVar6 + 1;
  local_58 = (ulong)(uint)(iVar17 * -2);
  local_80 = 0;
  lVar14 = 0;
  uVar10 = 0;
  local_48 = uVar9;
  while( true ) {
    uVar13 = local_48;
    pNVar7 = local_50;
    if ((uint)local_98 < (uint)uVar10) break;
    _phif = CONCAT44(uStack_a4,(float)uVar10 * 3.1415927 * local_6c);
    local_64 = (uint)uVar10 * uVar6;
    local_90 = uVar10;
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      local_9c = ((float)(uVar15 & 0xffffffff) + (float)(uVar15 & 0xffffffff)) * 3.1415927 *
                 local_5c;
      fVar18 = (center->field_0).m128[0];
      fVar19 = sinf(phif);
      fVar20 = sinf(local_9c);
      uVar16 = (int)uVar15 + (int)lVar14;
      ((this_00->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar16].field_0.m128[0] =
           fVar20 * fVar19 * radius + fVar18;
      fVar18 = (center->field_0).m128[1];
      fVar19 = cosf(phif);
      ((this_00->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar16].field_0.m128[1] =
           fVar19 * radius + fVar18;
      fVar18 = (center->field_0).m128[2];
      fVar19 = sinf(phif);
      fVar20 = cosf(local_9c);
      ((this_00->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar16].field_0.m128[2] =
           fVar20 * fVar19 * radius + fVar18;
    }
    if ((int)local_90 != 0) {
      uVar10 = local_90 & 0xffffffff;
      if ((int)local_90 == 1) {
        while (iVar17 = (int)uVar10, local_60 != iVar17) {
          local_b8.v1 = (uint)_p00;
          local_b8.v0 = local_b8.v1 + iVar17;
          local_b8.v2 = (int)(uVar10 % uVar9) + uVar6;
          local_b8.v3 = local_b8.v2;
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>
                    ((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                      *)local_88,&local_b8);
          uVar10 = (ulong)(iVar17 + 1);
        }
      }
      else if ((int)local_90 == (uint)local_98) {
        uVar16 = 0;
        while (uVar6 != uVar16) {
          local_b8.v1 = (int)local_40 + uVar16;
          uVar16 = uVar16 + 1;
          local_b8.v2 = uVar16 % uVar6 + (int)local_40;
          local_b8.v0 = local_68;
          local_b8.v3 = local_b8.v2;
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>
                    ((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                      *)local_88,&local_b8);
        }
      }
      else {
        _phif = (ulong)(((int)local_90 + -1) * uVar6);
        uVar10 = 1;
        uVar13 = local_80;
        for (iVar17 = 0; (int)local_58 != iVar17; iVar17 = iVar17 + -1) {
          uVar16 = (uint)uVar13;
          local_b8.v1 = (int)local_58 + uVar16;
          iVar11 = (int)(uVar10 % uVar9);
          local_b8.v2 = (int)_phif + iVar11;
          local_b8.v3 = iVar11 + local_64;
          local_b8.v0 = uVar16;
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>
                    ((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                      *)local_88,&local_b8);
          uVar10 = (ulong)((int)uVar10 + 1);
          uVar13 = (ulong)(uVar16 + 1);
        }
      }
    }
    uVar10 = (ulong)((int)local_90 + 1);
    lVar14 = lVar14 + local_48;
    local_80 = (ulong)((int)local_80 + uVar6);
  }
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar7;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createQuadSphere (const Vec3fa& center, const float radius, size_t N, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp(float(numTheta));
    const float rcpNumPhi   = rcp(float(numPhi));
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p11,p11));
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p01,p01));
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p01,p11));
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }